

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_clip.c
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  char cVar3;
  long lVar4;
  ALLEGRO_BITMAP *pAVar5;
  undefined8 uVar6;
  ALLEGRO_EVENT_QUEUE *pAVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  code *pcVar11;
  char *format;
  int iVar12;
  int iVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 in_XMM1_Da;
  undefined4 uVar16;
  float in_XMM1_Db;
  float fVar17;
  int ch;
  int cw;
  int cy;
  int cx;
  ALLEGRO_STATE state;
  undefined8 uStack_950;
  undefined1 *puStack_948;
  undefined1 *puStack_940;
  undefined1 auStack_930 [8];
  code *pcStack_928;
  char acStack_880 [1024];
  undefined1 auStack_460 [4];
  float local_45c;
  double local_458;
  double local_450;
  double local_448;
  undefined4 local_440;
  undefined4 local_43c;
  undefined4 local_438;
  undefined4 local_434;
  int local_430 [8];
  int local_410;
  
  pcVar11 = atexit;
  cVar3 = al_install_system(0x5020700);
  if (cVar3 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    pcVar11 = (code *)0x1e0;
    lVar4 = al_create_display(0x280);
    if (lVar4 == 0) {
      format = "Error creating display.\n";
    }
    else {
      ex.FPS = 0x3c;
      ex.font = (ALLEGRO_FONT *)al_create_builtin_font();
      if (ex.font != (ALLEGRO_FONT *)0x0) {
        uVar6 = al_color_name("beige");
        ex.background.b = (float)in_XMM1_Da;
        ex.background.r = (float)(int)uVar6;
        ex.background.g = (float)(int)((ulong)uVar6 >> 0x20);
        ex.background.a = in_XMM1_Db;
        uVar6 = al_color_name("blue");
        ex.text.b = (float)in_XMM1_Da;
        ex.text.r = (float)(int)uVar6;
        ex.text.g = (float)(int)((ulong)uVar6 >> 0x20);
        ex.text.a = in_XMM1_Db;
        uVar6 = al_color_name("white");
        ex.white.b = (float)in_XMM1_Da;
        ex.white.r = (float)(int)uVar6;
        ex.white.g = (float)(int)((ulong)uVar6 >> 0x20);
        ex.white.a = in_XMM1_Db;
        pAVar5 = (ALLEGRO_BITMAP *)al_create_bitmap(100,100);
        al_store_state(local_430,8);
        al_set_target_bitmap(pAVar5);
        iVar9 = 0;
        al_lock_bitmap(pAVar5,0,2);
        do {
          local_448 = (double)((float)iVar9 + -50.0);
          local_450 = local_448 * local_448;
          iVar10 = 0;
          do {
            local_458 = (double)((float)iVar10 + -50.0);
            dVar1 = atan2(local_448,local_458);
            uVar16 = SUB84(dVar1,0);
            uVar15 = (undefined4)((ulong)dVar1 >> 0x20);
            dVar2 = local_458 * local_458 + local_450;
            if (dVar2 < 0.0) {
              local_458 = dVar1;
              dVar2 = sqrt(dVar2);
              uVar16 = SUB84(local_458,0);
              uVar15 = (undefined4)((ulong)local_458 >> 0x20);
            }
            else {
              dVar2 = SQRT(dVar2);
            }
            local_458 = (double)CONCAT44(local_458._4_4_,(float)(double)CONCAT44(uVar15,uVar16));
            dVar1 = pow(1.0 - 1.0 / ((double)(float)dVar2 * 0.1 + 1.0),5.0);
            fVar17 = (local_458._0_4_ * 180.0) / 3.1415927;
            if ((((iVar10 == 99) || (iVar9 == 99)) || (iVar9 == 0)) || (iVar10 == 0)) {
              fVar17 = fVar17 + 180.0;
LAB_00102765:
              uVar16 = 0x3f800000;
            }
            else {
              if (((iVar10 != 0x62) && (iVar9 != 0x62)) && ((iVar9 != 1 && (iVar10 != 1))))
              goto LAB_00102765;
              fVar17 = fVar17 + 180.0;
              uVar16 = 0x3f000000;
            }
            al_color_hsl(fVar17,uVar16,(float)(1.0 - dVar1));
            al_put_pixel(iVar9,iVar10);
            iVar10 = iVar10 + 1;
          } while (iVar10 != 100);
          iVar9 = iVar9 + 1;
        } while (iVar9 != 100);
        al_unlock_bitmap(pAVar5);
        al_restore_state(local_430);
        ex.pattern = pAVar5;
        uVar6 = al_create_timer(SUB84(1.0 / (double)ex.FPS,0));
        pAVar7 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
        ex.queue = pAVar7;
        uVar8 = al_get_keyboard_event_source();
        al_register_event_source(pAVar7,uVar8);
        pAVar7 = ex.queue;
        uVar8 = al_get_mouse_event_source();
        al_register_event_source(pAVar7,uVar8);
        pAVar7 = ex.queue;
        uVar8 = al_get_display_event_source(lVar4);
        al_register_event_source(pAVar7,uVar8);
        pAVar7 = ex.queue;
        uVar8 = al_get_timer_event_source(uVar6);
        al_register_event_source(pAVar7,uVar8);
        al_start_timer(uVar6);
        do {
          bVar14 = true;
          while( true ) {
            while( true ) {
              if ((bVar14) && (cVar3 = al_is_event_queue_empty(ex.queue), cVar3 != '\0')) {
                iVar9 = al_get_bitmap_width(ex.pattern);
                iVar10 = al_get_bitmap_height(ex.pattern);
                al_get_clipping_rectangle(&local_434,&local_438,&local_43c,&local_440);
                bVar14 = false;
                al_set_blender(0,1,0);
                al_clear_to_color(ex.background.r,ex.background.b);
                ex.text_x = 8.0;
                ex.text_y = 8.0;
                print("al_draw_bitmap_region (%.1f fps)",
                      ~-(uint)(ex.timer[0] == 0.0) & SUB84(ex.counter[0] / ex.timer[0],0));
                local_458._0_4_ = ex.text_x;
                local_45c = ex.text_y;
                al_draw_bitmap(ex.pattern,0);
                dVar1 = (double)al_get_time();
                ex.timer[0] = ex.timer[0] - dVar1;
                ex.counter[0] = ex.counter[0] + 1.0;
                iVar12 = iVar9 + -2;
                iVar13 = iVar10 + -2;
                local_450._0_4_ = (float)iVar9;
                al_draw_bitmap_region
                          (0x3f800000,0x3f800000,(float)iVar12,(float)iVar13,
                           local_458._0_4_ + 8.0 + (float)iVar9 + 1.0,local_45c + 1.0,ex.pattern,0);
                dVar1 = (double)al_get_time();
                ex.timer[0] = dVar1 + ex.timer[0];
                local_448 = (double)CONCAT44(local_448._4_4_,(float)iVar10);
                ex.text_y = local_45c + (float)iVar10 + 8.0;
                ex.text_x = local_458._0_4_;
                print("al_create_sub_bitmap (%.1f fps)",
                      ~-(uint)(ex.timer[1] == 0.0) & SUB84(ex.counter[1] / ex.timer[1],0));
                local_458._0_4_ = ex.text_x;
                local_45c = ex.text_y;
                al_draw_bitmap(ex.pattern,0);
                dVar1 = (double)al_get_time();
                ex.timer[1] = ex.timer[1] - dVar1;
                ex.counter[1] = ex.counter[1] + 1.0;
                uVar6 = al_create_sub_bitmap(ex.pattern,1,1,iVar12,iVar13);
                al_draw_bitmap(local_458._0_4_ + 8.0 + local_450._0_4_ + 1.0,local_45c + 1.0,uVar6,0
                              );
                al_destroy_bitmap(uVar6);
                dVar1 = (double)al_get_time();
                ex.timer[1] = dVar1 + ex.timer[1];
                ex.text_y = local_45c + local_448._0_4_ + 8.0;
                ex.text_x = local_458._0_4_;
                print("al_set_clipping_rectangle (%.1f fps)",
                      ~-(uint)(ex.timer[2] == 0.0) & SUB84(ex.counter[2] / ex.timer[2],0));
                local_45c = ex.text_x;
                local_458 = (double)CONCAT44(local_458._4_4_,ex.text_y);
                al_draw_bitmap(ex.pattern,0);
                dVar1 = (double)al_get_time();
                ex.timer[2] = ex.timer[2] - dVar1;
                ex.counter[2] = ex.counter[2] + 1.0;
                local_450._0_4_ = local_45c + 8.0 + local_450._0_4_;
                al_set_clipping_rectangle
                          ((int)(local_450._0_4_ + 1.0),(int)(local_458._0_4_ + 1.0),iVar12,iVar13);
                al_draw_bitmap(local_450._0_4_,local_458._0_4_,ex.pattern,0);
                al_set_clipping_rectangle(local_434,local_438,local_43c,local_440);
                dVar1 = (double)al_get_time();
                ex.timer[2] = dVar1 + ex.timer[2];
                ex.text_y = local_458._0_4_ + local_448._0_4_ + 8.0;
                ex.text_x = local_45c;
                al_flip_display();
              }
              al_wait_for_event(ex.queue,local_430);
              if (local_430[0] != 10) break;
              if (local_410 == 0x3b) goto LAB_00102cb0;
            }
            if (local_430[0] == 0x1e) break;
            if (local_430[0] == 0x2a) {
LAB_00102cb0:
              al_destroy_event_queue(ex.queue);
              return 0;
            }
          }
        } while( true );
      }
      format = "Error creating builtin font.\n";
      ex.font = (ALLEGRO_FONT *)0x0;
    }
  }
  abort_example(format);
  pcStack_928 = pcVar11;
  iVar9 = al_get_font_line_height(ex.font);
  uStack_950 = 0x3000000008;
  puStack_948 = auStack_460;
  puStack_940 = auStack_930;
  vsnprintf(acStack_880,0x400,format,&uStack_950);
  al_set_blender(0,1,3);
  iVar10 = al_draw_textf(ex.text.r,ex.text.b,ex.text_x,ex.text_y,ex.font,0,"%s",acStack_880);
  ex.text_y = (float)iVar9 + ex.text_y;
  return iVar10;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}